

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

string * CLI::detail::fix_newlines(string *__return_storage_ptr__,string *leader,string *input)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  long lVar5;
  long *plVar6;
  undefined8 *puVar7;
  ulong *puVar8;
  ulong uVar9;
  ulong *local_b8;
  long local_b0;
  ulong local_a8 [2];
  ulong *local_98;
  long local_90;
  ulong local_88;
  long lStack_80;
  undefined8 *local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  string *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar9 = 0;
  local_58 = __return_storage_ptr__;
  do {
    if (input->_M_string_length <= uVar9) break;
    lVar5 = ::std::__cxx11::string::find((char)input,10);
    if (lVar5 == -1) {
      uVar9 = 0xffffffffffffffff;
    }
    else {
      ::std::__cxx11::string::substr((ulong)local_50,(ulong)input);
      plVar6 = (long *)::std::__cxx11::string::_M_append
                                 ((char *)local_50,(ulong)(leader->_M_dataplus)._M_p);
      puVar8 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar8) {
        local_88 = *puVar8;
        lStack_80 = plVar6[3];
        local_98 = &local_88;
      }
      else {
        local_88 = *puVar8;
        local_98 = (ulong *)*plVar6;
      }
      local_90 = plVar6[1];
      *plVar6 = (long)puVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      ::std::__cxx11::string::substr((ulong)&local_b8,(ulong)input);
      uVar9 = 0xf;
      if (local_98 != &local_88) {
        uVar9 = local_88;
      }
      if (uVar9 < (ulong)(local_b0 + local_90)) {
        uVar9 = 0xf;
        if (local_b8 != local_a8) {
          uVar9 = local_a8[0];
        }
        if (uVar9 < (ulong)(local_b0 + local_90)) goto LAB_0010bcdc;
        puVar7 = (undefined8 *)
                 ::std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_98);
      }
      else {
LAB_0010bcdc:
        puVar7 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_b8);
      }
      puVar1 = puVar7 + 2;
      if ((undefined8 *)*puVar7 == puVar1) {
        local_68 = *puVar1;
        uStack_60 = puVar7[3];
        local_78 = &local_68;
      }
      else {
        local_68 = *puVar1;
        local_78 = (undefined8 *)*puVar7;
      }
      local_70 = puVar7[1];
      *puVar7 = puVar1;
      puVar7[1] = 0;
      *(undefined1 *)puVar1 = 0;
      ::std::__cxx11::string::operator=((string *)input,(string *)&local_78);
      if (local_78 != &local_68) {
        operator_delete(local_78);
      }
      if (local_b8 != local_a8) {
        operator_delete(local_b8);
      }
      if (local_98 != &local_88) {
        operator_delete(local_98);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      uVar9 = lVar5 + leader->_M_string_length;
    }
  } while (uVar9 != 0xffffffffffffffff);
  (local_58->_M_dataplus)._M_p = (pointer)&local_58->field_2;
  pcVar3 = (input->_M_dataplus)._M_p;
  paVar2 = &input->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&input->field_2 + 8);
    (local_58->field_2)._M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&local_58->field_2 + 8) = uVar4;
  }
  else {
    (local_58->_M_dataplus)._M_p = pcVar3;
    (local_58->field_2)._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  local_58->_M_string_length = input->_M_string_length;
  (input->_M_dataplus)._M_p = (pointer)paVar2;
  input->_M_string_length = 0;
  (input->field_2)._M_local_buf[0] = '\0';
  return local_58;
}

Assistant:

inline std::string fix_newlines(const std::string &leader, std::string input) {
    std::string::size_type n = 0;
    while(n != std::string::npos && n < input.size()) {
        n = input.find('\n', n);
        if(n != std::string::npos) {
            input = input.substr(0, n + 1) + leader + input.substr(n + 1);
            n += leader.size();
        }
    }
    return input;
}